

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_value.hpp
# Opt level: O0

void __thiscall
chaiscript::Boxed_Value::Data::Data
          (Data *this,Type_Info *ti,Any *to,bool is_ref,void *t_void_ptr,bool t_return_value)

{
  undefined4 uVar1;
  bool bVar2;
  void *local_58;
  bool t_return_value_local;
  void *t_void_ptr_local;
  bool is_ref_local;
  Any *to_local;
  Type_Info *ti_local;
  Data *this_local;
  
  (this->m_type_info).m_type_info = ti->m_type_info;
  (this->m_type_info).m_bare_type_info = ti->m_bare_type_info;
  uVar1 = *(undefined4 *)&ti->field_0x14;
  (this->m_type_info).m_flags = ti->m_flags;
  *(undefined4 *)&(this->m_type_info).field_0x14 = uVar1;
  detail::Any::Any(&this->m_obj,to);
  bVar2 = Type_Info::is_const(ti);
  local_58 = t_void_ptr;
  if (bVar2) {
    local_58 = (void *)0x0;
  }
  this->m_data_ptr = local_58;
  this->m_const_data_ptr = t_void_ptr;
  std::
  unique_ptr<std::map<std::__cxx11::string,std::shared_ptr<chaiscript::Boxed_Value::Data>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<chaiscript::Boxed_Value::Data>>>>,std::default_delete<std::map<std::__cxx11::string,std::shared_ptr<chaiscript::Boxed_Value::Data>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<chaiscript::Boxed_Value::Data>>>>>>
  ::
  unique_ptr<std::default_delete<std::map<std::__cxx11::string,std::shared_ptr<chaiscript::Boxed_Value::Data>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<chaiscript::Boxed_Value::Data>>>>>,void>
            ((unique_ptr<std::map<std::__cxx11::string,std::shared_ptr<chaiscript::Boxed_Value::Data>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<chaiscript::Boxed_Value::Data>>>>,std::default_delete<std::map<std::__cxx11::string,std::shared_ptr<chaiscript::Boxed_Value::Data>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<chaiscript::Boxed_Value::Data>>>>>>
              *)&this->m_attrs);
  this->m_is_ref = is_ref;
  this->m_return_value = t_return_value;
  return;
}

Assistant:

Data(const Type_Info &ti, chaiscript::detail::Any to, bool is_ref, const void *t_void_ptr, bool t_return_value) noexcept
          : m_type_info(ti)
          , m_obj(std::move(to))
          , m_data_ptr(ti.is_const() ? nullptr : const_cast<void *>(t_void_ptr))
          , m_const_data_ptr(t_void_ptr)
          , m_is_ref(is_ref)
          , m_return_value(t_return_value) {
      }